

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O3

bool __thiscall
lunasvg::SVGRadialGradientElement::applyPaint
          (SVGRadialGradientElement *this,SVGRenderState *state,float opacity)

{
  SpreadMethod spread;
  pointer paVar1;
  pointer paVar2;
  SVGLength *pSVar3;
  float r;
  float fx;
  float fy;
  float cx;
  float cy;
  float e;
  float f;
  float a;
  float d;
  GradientStops gradientStops;
  LengthContext lengthContext;
  Transform gradientTransform;
  SVGRadialGradientAttributes attributes;
  GradientStops local_d0;
  LengthContext local_b8;
  Transform local_a8;
  SVGRadialGradientAttributes local_88;
  Transform local_40;
  
  collectGradientAttributes(&local_88,this);
  buildGradientStops(&local_d0,local_88.super_SVGGradientAttributes.m_gradientContentElement,opacity
                    );
  paVar2 = local_d0.
           super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  paVar1 = local_d0.
           super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (local_d0.super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d0.super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_b8.m_units =
         ((local_88.super_SVGGradientAttributes.m_gradientUnits)->m_gradientUnits).super_SVGProperty
         .field_0x9;
    local_b8.m_element = (SVGElement *)this;
    r = LengthContext::valueForLength
                  (&local_b8,(Length *)&((local_88.m_r)->m_r).super_SVGProperty.field_0xc,
                   ((local_88.m_r)->m_r).super_SVGProperty.field_0x9);
    a = 0.0;
    d = 0.0;
    if (((r == 0.0) && (!NAN(r))) ||
       ((long)local_d0.
              super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_d0.
              super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x14)) {
      Canvas::setColor((state->m_canvas).
                       super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       local_d0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.r,
                       local_d0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.g,
                       local_d0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.b,
                       local_d0.
                       super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].color.a);
    }
    else {
      pSVar3 = &(local_88.m_cx)->m_cx;
      if (local_88.m_fx != (SVGRadialGradientElement *)0x0) {
        pSVar3 = &(local_88.m_fx)->m_fx;
      }
      fx = LengthContext::valueForLength
                     (&local_b8,(Length *)&(pSVar3->super_SVGProperty).field_0xc,
                      (pSVar3->super_SVGProperty).field_0x9);
      pSVar3 = &(local_88.m_cy)->m_cy;
      if (local_88.m_fy != (SVGRadialGradientElement *)0x0) {
        pSVar3 = &(local_88.m_fy)->m_fy;
      }
      fy = LengthContext::valueForLength
                     (&local_b8,(Length *)&(pSVar3->super_SVGProperty).field_0xc,
                      (pSVar3->super_SVGProperty).field_0x9);
      cx = LengthContext::valueForLength
                     (&local_b8,(Length *)&((local_88.m_cx)->m_cx).super_SVGProperty.field_0xc,
                      ((local_88.m_cx)->m_cx).super_SVGProperty.field_0x9);
      cy = LengthContext::valueForLength
                     (&local_b8,(Length *)&((local_88.m_cy)->m_cy).super_SVGProperty.field_0xc,
                      ((local_88.m_cy)->m_cy).super_SVGProperty.field_0x9);
      spread = ((local_88.super_SVGGradientAttributes.m_spreadMethod)->m_spreadMethod).
               super_SVGProperty.field_0x9;
      local_a8.m_matrix.a =
           *(float *)&((local_88.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).super_SVGProperty.field_0xc;
      local_a8.m_matrix.b =
           *(float *)&((local_88.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x10;
      local_a8.m_matrix.c =
           *(float *)&((local_88.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x14;
      local_a8.m_matrix.d =
           *(float *)&((local_88.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x18;
      local_a8.m_matrix.e =
           *(float *)&((local_88.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x1c;
      local_a8.m_matrix.f =
           *(float *)&((local_88.super_SVGGradientAttributes.m_gradientTransform)->
                      m_gradientTransform).field_0x20;
      if (((local_88.super_SVGGradientAttributes.m_gradientUnits)->m_gradientUnits).
          super_SVGProperty.field_0x9 == '\x01') {
        (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
        Transform::Transform(&local_40,a,0.0,0.0,d,e,f);
        Transform::postMultiply(&local_a8,&local_40);
      }
      Canvas::setRadialGradient
                ((state->m_canvas).super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,cx,cy,r,fx,fy,spread,&local_d0,&local_a8);
    }
  }
  if (local_d0.super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<plutovg_gradient_stop_t,_std::allocator<plutovg_gradient_stop_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return paVar1 != paVar2;
}

Assistant:

bool SVGRadialGradientElement::applyPaint(SVGRenderState& state, float opacity) const
{
    auto attributes = collectGradientAttributes();
    auto gradientContentElement = attributes.gradientContentElement();
    auto gradientStops = buildGradientStops(gradientContentElement, opacity);
    if(gradientStops.empty())
        return false;
    LengthContext lengthContext(this, attributes.gradientUnits());
    auto r = lengthContext.valueForLength(attributes.r());
    if(r == 0.f || gradientStops.size() == 1) {
        const auto& lastStop = gradientStops.back();
        state->setColor(lastStop.color.r, lastStop.color.g, lastStop.color.b, lastStop.color.a);
        return true;
    }

    auto fx = lengthContext.valueForLength(attributes.fx());
    auto fy = lengthContext.valueForLength(attributes.fy());
    auto cx = lengthContext.valueForLength(attributes.cx());
    auto cy = lengthContext.valueForLength(attributes.cy());

    auto spreadMethod = attributes.spreadMethod();
    auto gradientUnits = attributes.gradientUnits();
    auto gradientTransform = attributes.gradientTransform();
    if(gradientUnits == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        gradientTransform.postMultiply(Transform(bbox.w, 0, 0, bbox.h, bbox.x, bbox.y));
    }

    state->setRadialGradient(cx, cy, r, fx, fy, spreadMethod, gradientStops, gradientTransform);
    return true;
}